

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O3

slice_instructions *
llava_uhd::get_slice_instructions
          (slice_instructions *__return_storage_ptr__,clip_ctx *ctx,clip_image_size *original_size)

{
  pointer *ppsVar1;
  iterator iVar2;
  bool bVar3;
  clip_image_size cVar4;
  clip_image_size cVar5;
  clip_image_size cVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  float fVar17;
  float log_ratio;
  slice_coordinates slice;
  clip_image_size best_grid;
  slice_coordinates local_78;
  clip_image_size local_68;
  vector<llava_uhd::slice_coordinates,std::allocator<llava_uhd::slice_coordinates>> *local_60;
  undefined8 local_58;
  float fStack_50;
  float fStack_4c;
  slice_instructions *local_48;
  undefined8 uStack_40;
  ulong local_38;
  
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->slices).
           super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->slices).
           super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (__return_storage_ptr__->slices).
  super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->slices).
  super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar7 = (ctx->vision_model).hparams.image_size;
  if ((ctx->has_minicpmv_projector != true) || (iVar11 = 9, ctx->minicpmv_version == 0)) {
    iVar11 = 0;
  }
  local_60 = (vector<llava_uhd::slice_coordinates,std::allocator<llava_uhd::slice_coordinates>> *)
             &__return_storage_ptr__->slices;
  iVar14 = (ctx->vision_model).hparams.patch_size;
  fVar17 = (float)(*original_size).width;
  fStack_50 = (float)(*original_size).height;
  local_48 = (slice_instructions *)CONCAT44(fStack_50,fVar17);
  uStack_40 = 0;
  fStack_4c = fStack_50;
  local_58._0_4_ = fStack_50;
  local_58._4_4_ = fStack_50;
  log_ratio = logf(fVar17 / fStack_50);
  fVar17 = ceilf(((float)local_58 * local_48._0_4_) / (float)(iVar7 * iVar7));
  local_48 = __return_storage_ptr__;
  if ((ctx->vision_model).hparams.image_grid_pinpoints.super__Vector_base<int,_std::allocator<int>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (ctx->vision_model).hparams.image_grid_pinpoints.super__Vector_base<int,_std::allocator<int>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if ((float)iVar11 <= fVar17) {
      fVar17 = (float)iVar11;
    }
    iVar13 = (int)fVar17;
    cVar6 = get_best_resize(original_size,iVar7,iVar14,1 < iVar13);
    __return_storage_ptr__->overview_size = cVar6;
    if (iVar13 < 2) {
      (__return_storage_ptr__->refined_size).width = 0;
      (__return_storage_ptr__->refined_size).height = 0;
      (__return_storage_ptr__->grid_size).width = 0;
      (__return_storage_ptr__->grid_size).height = 0;
    }
    else {
      local_68 = get_best_grid(iVar11,iVar13,log_ratio);
      cVar6 = get_refine_size(original_size,&local_68,iVar7,iVar14,true);
      uVar10 = (ulong)cVar6 >> 0x20;
      __return_storage_ptr__->grid_size = local_68;
      iVar14 = cVar6.width;
      (__return_storage_ptr__->refined_size).width = iVar14;
      iVar11 = cVar6.height;
      (__return_storage_ptr__->refined_size).height = iVar11;
      iVar7 = local_68.width;
      uVar8 = (ulong)local_68 >> 0x20;
      local_58 = CONCAT44(local_58._4_4_,
                          (int)((long)((ulong)(uint)(iVar11 >> 0x1f) << 0x20 | uVar10) /
                               (long)local_68.height));
      if ((local_68.height != 0 && -1 < (long)local_68) && (iVar11 != 0 && -1 < (long)cVar6)) {
        iVar11 = 0;
        iVar13 = 0;
        local_38 = uVar10;
        do {
          if (0 < local_68.width && 0 < iVar14) {
            iVar15 = 0;
            iVar12 = local_68.width;
            iVar16 = 1;
            do {
              iVar9 = (int)((long)((ulong)(uint)(iVar14 >> 0x1f) << 0x20 | (ulong)cVar6 & 0xffffffff
                                  ) / (long)iVar7);
              local_78.size.height = (int)(float)local_58;
              iVar2._M_current =
                   (__return_storage_ptr__->slices).
                   super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar2._M_current ==
                  (__return_storage_ptr__->slices).
                  super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                local_78.x = iVar15;
                local_78.y = iVar13;
                local_78.size.width = iVar9;
                std::
                vector<llava_uhd::slice_coordinates,std::allocator<llava_uhd::slice_coordinates>>::
                _M_realloc_insert<llava_uhd::slice_coordinates_const&>(local_60,iVar2,&local_78);
                iVar12 = local_68.width;
              }
              else {
                cVar5.height = (int)(float)local_58;
                cVar5.width = iVar9;
                (iVar2._M_current)->x = iVar15;
                (iVar2._M_current)->y = iVar13;
                (iVar2._M_current)->size = cVar5;
                ppsVar1 = &(__return_storage_ptr__->slices).
                           super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppsVar1 = *ppsVar1 + 1;
              }
              iVar15 = iVar15 + iVar9;
            } while ((iVar15 < iVar14) && (bVar3 = iVar16 < iVar12, iVar16 = iVar16 + 1, bVar3));
            uVar8 = (ulong)local_68 >> 0x20;
            uVar10 = local_38;
          }
          iVar13 = iVar13 + (int)(float)local_58;
        } while ((iVar13 < (int)uVar10) && (iVar11 = iVar11 + 1, iVar11 < (int)uVar8));
      }
    }
  }
  else {
    cVar6 = select_best_resolution(&(ctx->vision_model).hparams.image_grid_pinpoints,original_size);
    uVar8 = (ulong)cVar6 >> 0x20;
    (__return_storage_ptr__->overview_size).width = iVar7;
    (__return_storage_ptr__->overview_size).height = iVar7;
    iVar11 = cVar6.width;
    (__return_storage_ptr__->refined_size).width = iVar11;
    (__return_storage_ptr__->refined_size).height = cVar6.height;
    (__return_storage_ptr__->grid_size).width = 0;
    (__return_storage_ptr__->grid_size).height = 0;
    __return_storage_ptr__->padding_refined = true;
    if (cVar6.height != 0 && -1 < (long)cVar6) {
      iVar14 = 0;
      iVar13 = 0;
      local_58 = uVar8;
      do {
        if (0 < iVar11) {
          iVar14 = (int)uVar8 - iVar13;
          if (iVar7 <= iVar14) {
            iVar14 = iVar7;
          }
          iVar12 = 0;
          uVar8 = (ulong)cVar6 & 0xffffffff;
          do {
            local_78.size.width = (int)uVar8;
            uVar8 = (ulong)(uint)(local_78.size.width - iVar7);
            if (iVar7 <= local_78.size.width) {
              local_78.size.width = iVar7;
            }
            iVar2._M_current =
                 (local_48->slices).
                 super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (local_48->slices).
                super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_78.x = iVar12;
              local_78.y = iVar13;
              local_78.size.height = iVar14;
              std::vector<llava_uhd::slice_coordinates,std::allocator<llava_uhd::slice_coordinates>>
              ::_M_realloc_insert<llava_uhd::slice_coordinates_const&>(local_60,iVar2,&local_78);
            }
            else {
              cVar4.height = iVar14;
              cVar4.width = local_78.size.width;
              (iVar2._M_current)->x = iVar12;
              (iVar2._M_current)->y = iVar13;
              (iVar2._M_current)->size = cVar4;
              ppsVar1 = &(local_48->slices).
                         super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppsVar1 = *ppsVar1 + 1;
            }
            if (iVar12 == 0) {
              (local_48->grid_size).width = (local_48->grid_size).width + 1;
            }
            iVar12 = iVar12 + iVar7;
          } while (iVar12 < iVar11);
          iVar14 = (local_48->grid_size).height;
          uVar8 = local_58;
          __return_storage_ptr__ = local_48;
        }
        iVar14 = iVar14 + 1;
        (__return_storage_ptr__->grid_size).height = iVar14;
        iVar13 = iVar13 + iVar7;
      } while (iVar13 < (int)uVar8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static slice_instructions get_slice_instructions(struct clip_ctx * ctx, const clip_image_size & original_size) {
        slice_instructions res;
        const int patch_size      = clip_get_patch_size(ctx);
        const int slice_size      = clip_get_image_size(ctx);
        const int max_slice_nums  = get_max_slices(ctx);
        const int original_width  = original_size.width;
        const int original_height = original_size.height;
        const float log_ratio = log((float)original_width / original_height);
        const float ratio = (float)original_width * original_height / (slice_size * slice_size);
        const int multiple = fmin(ceil(ratio), max_slice_nums);
        const bool has_slices = (multiple > 1);
        const bool has_pinpoints = !ctx->vision_model.hparams.image_grid_pinpoints.empty();

        if (has_pinpoints) {
            // has pinpoints, use them to calculate the grid size (e.g. llava-1.6)
            auto refine_size = llava_uhd::select_best_resolution(
                ctx->vision_model.hparams.image_grid_pinpoints,
                original_size);
            res.overview_size   = clip_image_size{slice_size, slice_size};
            res.refined_size    = refine_size;
            res.grid_size       = clip_image_size{0, 0};
            res.padding_refined = true;

            for (int y = 0; y < refine_size.height; y += slice_size) {
                for (int x = 0; x < refine_size.width; x += slice_size) {
                    slice_coordinates slice;
                    slice.x = x;
                    slice.y = y;
                    slice.size.width  = std::min(slice_size, refine_size.width  - x);
                    slice.size.height = std::min(slice_size, refine_size.height - y);
                    res.slices.push_back(slice);
                    if (x == 0) {
                        res.grid_size.width++;
                    }
                }
                res.grid_size.height++;
            }

            return res;
        }

        // no pinpoints, dynamically calculate the grid size (e.g. minicpmv)

        auto best_size    = get_best_resize(original_size, slice_size, patch_size, has_slices);
        res.overview_size = best_size;

        if (!has_slices) {
            // skip slicing logic
            res.refined_size = clip_image_size{0, 0};
            res.grid_size    = clip_image_size{0, 0};

        } else {
            auto best_grid   = get_best_grid(max_slice_nums, multiple, log_ratio);
            auto refine_size = get_refine_size(original_size, best_grid, slice_size, patch_size, true);
            res.grid_size    = best_grid;
            res.refined_size = refine_size;

            int width  = refine_size.width;
            int height = refine_size.height;
            int grid_x = int(width  / best_grid.width);
            int grid_y = int(height / best_grid.height);
            for (int patches_y = 0,                    ic = 0;
                    patches_y < refine_size.height && ic < best_grid.height;
                    patches_y += grid_y,              ic += 1) {
                for (int patches_x = 0,                   jc = 0;
                        patches_x < refine_size.width && jc < best_grid.width;
                        patches_x += grid_x,             jc += 1) {
                    slice_coordinates slice;
                    slice.x = patches_x;
                    slice.y = patches_y;
                    slice.size.width  = grid_x;
                    slice.size.height = grid_y;
                    res.slices.push_back(slice);
                    // LOG_INF("slice %d: %d %d %d %d\n", ic, patches_i, patches_j, grid_x, grid_y);
                }
            }
        }

        return res;
    }